

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

int SimpleLoggerMgr::init(EVP_PKEY_CTX *ctx)

{
  __base_type this;
  atomic<SimpleLoggerMgr_*> aVar1;
  
  aVar1._M_b._M_p = instance._M_b._M_p;
  if (instance._M_b._M_p == (__pointer_type)0x0) {
    std::mutex::lock(&instanceLock);
    if (instance._M_b._M_p == (__pointer_type)0x0) {
      this._M_p = (__pointer_type)operator_new(0x450);
      SimpleLoggerMgr(this._M_p);
      instance._M_b._M_p = (__base_type)(__base_type)this._M_p;
    }
    aVar1._M_b._M_p = instance._M_b._M_p;
    pthread_mutex_unlock((pthread_mutex_t *)&instanceLock);
  }
  return SUB84(aVar1._M_b._M_p,0);
}

Assistant:

void SimpleLogger::setCriticalInfo(const std::string& info_str) {
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    if (mgr) {
        mgr->setCriticalInfo(info_str);
    }
}